

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O1

LY_ERR lyplg_type_check_hints
                 (uint32_t hints,char *value,size_t value_len,LY_DATA_TYPE type,int *base,
                 ly_err_item **err)

{
  LY_ERR LVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  char *err_format;
  
  if (value_len != 0 && value == (char *)0x0) {
    pcVar5 = "value || !value_len";
    goto LAB_0019f780;
  }
  if (err == (ly_err_item **)0x0) {
    pcVar5 = "err";
    goto LAB_0019f780;
  }
  *err = (ly_err_item *)0x0;
  pcVar5 = "";
  if (value != (char *)0x0) {
    pcVar5 = value;
  }
  LVar1 = LY_SUCCESS;
  switch(type) {
  case LY_TYPE_UNKNOWN:
  case LY_TYPE_LEAFREF:
  case LY_TYPE_UNION:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types.c",
           0x2db);
    return LY_EINT;
  case LY_TYPE_BINARY:
  case LY_TYPE_STRING:
  case LY_TYPE_BITS:
  case LY_TYPE_DEC64:
  case LY_TYPE_ENUM:
  case LY_TYPE_IDENT:
  case LY_TYPE_INST:
    if ((hints & 1) != 0) {
      return LY_SUCCESS;
    }
    pcVar3 = lys_datatype2str(type);
    err_format = "Invalid non-string-encoded %s value \"%.*s\".";
    break;
  case LY_TYPE_UINT8:
  case LY_TYPE_UINT16:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT8:
  case LY_TYPE_INT16:
  case LY_TYPE_INT32:
    if (base != (int *)0x0) {
      switch(hints & 0xe) {
      case 0:
        pcVar3 = lys_datatype2str(type);
        err_format = "Invalid non-number-encoded %s value \"%.*s\".";
        goto LAB_0019f74e;
      case 2:
        iVar2 = 10;
        break;
      case 4:
        iVar2 = 8;
        break;
      default:
        iVar2 = 0;
        break;
      case 8:
        iVar2 = 0x10;
      }
LAB_0019f8d4:
      *base = iVar2;
      return LY_SUCCESS;
    }
LAB_0019f83c:
    pcVar5 = "base";
LAB_0019f780:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,
           "lyplg_type_check_hints");
    return LY_EINVAL;
  case LY_TYPE_UINT64:
  case LY_TYPE_INT64:
    if (base == (int *)0x0) goto LAB_0019f83c;
    if ((hints & 0x10) != 0) {
      uVar4 = (hints & 0xe) - 2;
      iVar2 = 0;
      if (uVar4 < 7) {
        iVar2 = *(int *)(&DAT_001dd4a0 + (ulong)uVar4 * 4);
      }
      goto LAB_0019f8d4;
    }
    pcVar3 = lys_datatype2str(type);
    err_format = "Invalid non-num64-encoded %s value \"%.*s\".";
    break;
  case LY_TYPE_BOOL:
    if ((hints & 0x20) != 0) {
      return LY_SUCCESS;
    }
    pcVar3 = lys_datatype2str(LY_TYPE_BOOL);
    err_format = "Invalid non-boolean-encoded %s value \"%.*s\".";
    break;
  case LY_TYPE_EMPTY:
    if ((hints & 0x40) != 0) {
      return LY_SUCCESS;
    }
    pcVar3 = lys_datatype2str(LY_TYPE_EMPTY);
    err_format = "Invalid non-empty-encoded %s value \"%.*s\".";
    break;
  default:
    goto switchD_0019f731_default;
  }
LAB_0019f74e:
  LVar1 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,err_format,pcVar3,value_len,
                     pcVar5);
switchD_0019f731_default:
  return LVar1;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_type_check_hints(uint32_t hints, const char *value, size_t value_len, LY_DATA_TYPE type, int *base,
        struct ly_err_item **err)
{
    LY_CHECK_ARG_RET(NULL, value || !value_len, err, LY_EINVAL);

    *err = NULL;
    if (!value) {
        value = "";
    }

    switch (type) {
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
        LY_CHECK_ARG_RET(NULL, base, LY_EINVAL);

        if (!(hints & (LYD_VALHINT_DECNUM | LYD_VALHINT_OCTNUM | LYD_VALHINT_HEXNUM))) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-number-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        *base = type_get_hints_base(hints);
        break;
    case LY_TYPE_UINT64:
    case LY_TYPE_INT64:
        LY_CHECK_ARG_RET(NULL, base, LY_EINVAL);

        if (!(hints & LYD_VALHINT_NUM64)) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-num64-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        *base = type_get_hints_base(hints);
        break;
    case LY_TYPE_STRING:
    case LY_TYPE_DEC64:
    case LY_TYPE_ENUM:
    case LY_TYPE_BITS:
    case LY_TYPE_BINARY:
    case LY_TYPE_IDENT:
    case LY_TYPE_INST:
        if (!(hints & LYD_VALHINT_STRING)) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-string-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        break;
    case LY_TYPE_BOOL:
        if (!(hints & LYD_VALHINT_BOOLEAN)) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-boolean-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        break;
    case LY_TYPE_EMPTY:
        if (!(hints & LYD_VALHINT_EMPTY)) {
            return ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid non-empty-encoded %s value \"%.*s\".",
                    lys_datatype2str(type), (int)value_len, value);
        }
        break;
    case LY_TYPE_UNKNOWN:
    case LY_TYPE_LEAFREF:
    case LY_TYPE_UNION:
        LOGINT_RET(NULL);
    }

    return LY_SUCCESS;
}